

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_integer_test.cc
# Opt level: O1

void __thiscall AomLeb128_EncodeFailTest_Test::TestBody(AomLeb128_EncodeFailTest_Test *this)

{
  undefined8 *puVar1;
  SEARCH_METHODS *pSVar2;
  AssertionResult gtest_ar;
  uint8_t write_buffer [4];
  size_t coded_size;
  Message local_40;
  AssertHelper local_38;
  internal local_30 [8];
  undefined8 *local_28;
  uint8_t local_1c [4];
  size_t local_18;
  
  local_1c[0] = '\0';
  local_1c[1] = '\0';
  local_1c[2] = '\0';
  local_1c[3] = '\0';
  local_18 = 0;
  local_40.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = aom_uleb_encode(1,4,(uint8_t *)0x0,&local_18);
  local_38.data_._0_4_ = 0xffffffff;
  testing::internal::CmpHelperEQ<int,int>
            (local_30,"aom_uleb_encode(kValidTestValue, kWriteBufferSize, nullptr, &coded_size)",
             "-1",(int *)&local_40,(int *)&local_38);
  puVar1 = local_28;
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message(&local_40);
    if (local_28 == (undefined8 *)0x0) {
      pSVar2 = "";
    }
    else {
      pSVar2 = (SEARCH_METHODS *)*local_28;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_integer_test.cc"
               ,0x9d,(char *)pSVar2);
    testing::internal::AssertHelper::operator=(&local_38,&local_40);
  }
  else {
    if (local_28 != (undefined8 *)0x0) {
      if ((undefined8 *)*local_28 != local_28 + 2) {
        operator_delete((undefined8 *)*local_28);
      }
      operator_delete(puVar1);
    }
    local_40.ss_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._0_4_ = aom_uleb_encode(1,4,local_1c,(size_t *)0x0);
    local_38.data_._0_4_ = 0xffffffff;
    testing::internal::CmpHelperEQ<int,int>
              (local_30,
               "aom_uleb_encode(kValidTestValue, kWriteBufferSize, &write_buffer[0], nullptr)","-1",
               (int *)&local_40,(int *)&local_38);
    puVar1 = local_28;
    if (local_30[0] == (internal)0x0) {
      testing::Message::Message(&local_40);
      if (local_28 == (undefined8 *)0x0) {
        pSVar2 = "";
      }
      else {
        pSVar2 = (SEARCH_METHODS *)*local_28;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_38,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_integer_test.cc"
                 ,0xa0,(char *)pSVar2);
      testing::internal::AssertHelper::operator=(&local_38,&local_40);
    }
    else {
      if (local_28 != (undefined8 *)0x0) {
        if ((undefined8 *)*local_28 != local_28 + 2) {
          operator_delete((undefined8 *)*local_28);
        }
        operator_delete(puVar1);
      }
      local_40.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._0_4_ = aom_uleb_encode(0xffffffff,4,local_1c,&local_18);
      local_38.data_._0_4_ = 0xffffffff;
      testing::internal::CmpHelperEQ<int,int>
                (local_30,
                 "aom_uleb_encode(kValueOutOfRangeForBuffer, kWriteBufferSize, &write_buffer[0], &coded_size)"
                 ,"-1",(int *)&local_40,(int *)&local_38);
      puVar1 = local_28;
      if (local_30[0] == (internal)0x0) {
        testing::Message::Message(&local_40);
        if (local_28 == (undefined8 *)0x0) {
          pSVar2 = "";
        }
        else {
          pSVar2 = (SEARCH_METHODS *)*local_28;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_38,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_integer_test.cc"
                   ,0xa5,(char *)pSVar2);
        testing::internal::AssertHelper::operator=(&local_38,&local_40);
      }
      else {
        if (local_28 != (undefined8 *)0x0) {
          if ((undefined8 *)*local_28 != local_28 + 2) {
            operator_delete((undefined8 *)*local_28);
          }
          operator_delete(puVar1);
        }
        local_40.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._0_4_ = aom_uleb_encode(0x100000000,4,local_1c,&local_18);
        local_38.data_._0_4_ = 0xffffffff;
        testing::internal::CmpHelperEQ<int,int>
                  (local_30,
                   "aom_uleb_encode(kValueOutOfRange, kWriteBufferSize, &write_buffer[0], &coded_size)"
                   ,"-1",(int *)&local_40,(int *)&local_38);
        puVar1 = local_28;
        if (local_30[0] == (internal)0x0) {
          testing::Message::Message(&local_40);
          if (local_28 == (undefined8 *)0x0) {
            pSVar2 = "";
          }
          else {
            pSVar2 = (SEARCH_METHODS *)*local_28;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_integer_test.cc"
                     ,0xaa,(char *)pSVar2);
          testing::internal::AssertHelper::operator=(&local_38,&local_40);
        }
        else {
          if (local_28 != (undefined8 *)0x0) {
            if ((undefined8 *)*local_28 != local_28 + 2) {
              operator_delete((undefined8 *)*local_28);
            }
            operator_delete(puVar1);
          }
          local_40.ss_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._0_4_ = aom_uleb_encode_fixed_size(1,4,5,local_1c,&local_18);
          local_38.data_._0_4_ = 0xffffffff;
          testing::internal::CmpHelperEQ<int,int>
                    (local_30,
                     "aom_uleb_encode_fixed_size(kValidTestValue, kWriteBufferSize, kPadSizeOutOfRange, &write_buffer[0], &coded_size)"
                     ,"-1",(int *)&local_40,(int *)&local_38);
          if (local_30[0] != (internal)0x0) goto LAB_0045b325;
          testing::Message::Message(&local_40);
          if (local_28 == (undefined8 *)0x0) {
            pSVar2 = "";
          }
          else {
            pSVar2 = (SEARCH_METHODS *)*local_28;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_38,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/aom_integer_test.cc"
                     ,0xb0,(char *)pSVar2);
          testing::internal::AssertHelper::operator=(&local_38,&local_40);
        }
      }
    }
  }
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if ((long *)CONCAT44(local_40.ss_._M_t.
                       super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl._4_4_,
                       (int)local_40.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl) != (long *)0x0) {
    (**(code **)(*(long *)CONCAT44(local_40.ss_._M_t.
                                   super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   .
                                   super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                   ._M_head_impl._4_4_,
                                   (int)local_40.ss_._M_t.
                                        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        .
                                        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        ._M_head_impl) + 8))();
  }
LAB_0045b325:
  if (local_28 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_28 != local_28 + 2) {
      operator_delete((undefined8 *)*local_28);
    }
    operator_delete(local_28);
  }
  return;
}

Assistant:

TEST(AomLeb128, EncodeFailTest) {
  const size_t kWriteBufferSize = 4;
  const uint32_t kValidTestValue = 1;
  uint8_t write_buffer[kWriteBufferSize] = { 0 };
  size_t coded_size = 0;
  ASSERT_EQ(
      aom_uleb_encode(kValidTestValue, kWriteBufferSize, nullptr, &coded_size),
      -1);
  ASSERT_EQ(aom_uleb_encode(kValidTestValue, kWriteBufferSize, &write_buffer[0],
                            nullptr),
            -1);

  const uint32_t kValueOutOfRangeForBuffer = 0xFFFFFFFF;
  ASSERT_EQ(aom_uleb_encode(kValueOutOfRangeForBuffer, kWriteBufferSize,
                            &write_buffer[0], &coded_size),
            -1);

  const uint64_t kValueOutOfRange = kMaximumLeb128Value + 1;
  ASSERT_EQ(aom_uleb_encode(kValueOutOfRange, kWriteBufferSize,
                            &write_buffer[0], &coded_size),
            -1);

  const size_t kPadSizeOutOfRange = 5;
  ASSERT_EQ(aom_uleb_encode_fixed_size(kValidTestValue, kWriteBufferSize,
                                       kPadSizeOutOfRange, &write_buffer[0],
                                       &coded_size),
            -1);
}